

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall CProficiencies::SetProf(CProficiencies *this,int profindex,int proflevel)

{
  size_t sVar1;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int *unaff_retaddr;
  CLogger *in_stack_00000008;
  string_view in_stack_00000010;
  size_t profs_size;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  sVar1 = std::size<int,25ul>((int (*) [25])(in_RDI + 0x14));
  if ((in_ESI < 0) || (sVar1 - 1 < (ulong)(long)in_ESI)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    CLogger::Warn<int&>(in_stack_00000008,in_stack_00000010,unaff_retaddr);
  }
  else {
    *(undefined4 *)(in_RDI + 0x14 + (long)in_ESI * 4) = in_EDX;
  }
  return;
}

Assistant:

void CProficiencies::SetProf(int profindex, int proflevel)
{
	auto profs_size = std::size(profs);
	if (profindex < 0 || profindex > profs_size - 1)
	{
		RS.Logger.Warn("CProficiencies::SetProf : profindex out of bounds [{}]", profindex);
		return;
	}

	profs[profindex] = proflevel;

	return;
}